

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdFreeBlindHandle(void *handle,void *blind_handle)

{
  void *pvVar1;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiBlindTxData *blind_tx_struct;
  vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>
  *in_stack_ffffffffffffff70;
  allocator local_51;
  string local_50 [4];
  uint32_t in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  
  cfd::Initialize();
  if (in_RSI != 0) {
    if (*(long *)(in_RSI + 0x10) != 0) {
      pvVar1 = *(void **)(in_RSI + 0x10);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::api::TxInBlindParameters,_std::allocator<cfd::api::TxInBlindParameters>_>::
        ~vector(in_stack_ffffffffffffff70);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(in_RSI + 0x10) = 0;
    }
    if (*(long *)(in_RSI + 0x18) != 0) {
      pvVar1 = *(void **)(in_RSI + 0x18);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_>::~vector
                  ((vector<cfd::api::TxOutBlindKeys,_std::allocator<cfd::api::TxOutBlindKeys>_> *)
                   in_stack_ffffffffffffff70);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(in_RSI + 0x18) = 0;
    }
    if (*(long *)(in_RSI + 0x38) != 0) {
      pvVar1 = *(void **)(in_RSI + 0x38);
      if (pvVar1 != (void *)0x0) {
        std::vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_>::~vector
                  ((vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)
                   in_stack_ffffffffffffff70);
        operator_delete(pvVar1);
      }
      *(undefined8 *)(in_RSI + 0x38) = 0;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"BlindTxData",&local_51);
  cfd::capi::FreeBuffer
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return 0;
}

Assistant:

int CfdFreeBlindHandle(void* handle, void* blind_handle) {
  try {
    cfd::Initialize();
    if (blind_handle != nullptr) {
      CfdCapiBlindTxData* blind_tx_struct =
          static_cast<CfdCapiBlindTxData*>(blind_handle);
      if (blind_tx_struct->txin_blind_keys != nullptr) {
        delete blind_tx_struct->txin_blind_keys;
        blind_tx_struct->txin_blind_keys = nullptr;
      }
      if (blind_tx_struct->txout_blind_keys != nullptr) {
        delete blind_tx_struct->txout_blind_keys;
        blind_tx_struct->txout_blind_keys = nullptr;
      }
      if (blind_tx_struct->blinder_list != nullptr) {
        delete blind_tx_struct->blinder_list;
        blind_tx_struct->blinder_list = nullptr;
      }
    }
    FreeBuffer(blind_handle, kPrefixBlindTxData, sizeof(CfdCapiBlindTxData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}